

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lesson.h
# Opt level: O3

void __thiscall
Lesson::Lesson(Lesson *this,size_t lesson_id,bool exist,bool doubled,bool moveable,string *subject,
              string *room,string *professor,string *time)

{
  pointer pcVar1;
  
  this->lesson_id = lesson_id;
  this->exist = exist;
  this->doubled = doubled;
  this->moveable = moveable;
  (this->subject)._M_dataplus._M_p = (pointer)&(this->subject).field_2;
  pcVar1 = (subject->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->subject,pcVar1,pcVar1 + subject->_M_string_length);
  (this->room)._M_dataplus._M_p = (pointer)&(this->room).field_2;
  pcVar1 = (room->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->room,pcVar1,pcVar1 + room->_M_string_length);
  (this->professor)._M_dataplus._M_p = (pointer)&(this->professor).field_2;
  pcVar1 = (professor->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->professor,pcVar1,pcVar1 + professor->_M_string_length);
  (this->prep_list).super__Vector_base<Professor,_std::allocator<Professor>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->prep_list).super__Vector_base<Professor,_std::allocator<Professor>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->prep_list).super__Vector_base<Professor,_std::allocator<Professor>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->time)._M_dataplus._M_p = (pointer)&(this->time).field_2;
  pcVar1 = (time->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->time,pcVar1,pcVar1 + time->_M_string_length);
  return;
}

Assistant:

Lesson(size_t lesson_id = 0, bool exist = false, bool doubled = false, bool moveable = false, std::string subject = "" ,std::string room = "", std::string professor = "", std::string time = "") :
            lesson_id(lesson_id),
            doubled(doubled),
            moveable(moveable),
            exist(exist),
            subject(subject),
            room(room),
            professor(professor),
            prep_list(),
            time(time)
            { }